

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureStandard,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcControl *this;
  
  this = (IfcControl *)operator_new(0x108);
  *(undefined ***)&this->field_0xf0 = &PTR__Object_00816a50;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  *(char **)&this[1].super_IfcObject.field_0x8 = "IfcFurnitureStandard";
  Assimp::IFC::Schema_2x3::IfcControl::IfcControl(this,&PTR_construction_vtable_24__008633c0);
  *(undefined ***)&this->super_IfcObject = &PTR__IfcFurnitureStandard_008632e0;
  *(undefined ***)&this->field_0xf0 = &PTR__IfcFurnitureStandard_008633a8;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcFurnitureStandard_00863308;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcFurnitureStandard_00863330;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcFurnitureStandard_00863358;
  *(undefined ***)&(this->super_IfcObject).field_0xe0 = &PTR__IfcFurnitureStandard_00863380;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObject>(db,params,(IfcObject *)this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }